

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O3

Vec_Int_t * Llb_ManComputeBaseCase(Aig_Man_t *p,DdManager *dd)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  int *local_48;
  
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = *p->vCos->pArray;
  pVVar7 = p->vObjs;
  uVar1 = pVVar7->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar4 = uVar1;
  }
  pVVar6->nCap = uVar4;
  if (uVar4 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = uVar1;
  }
  else {
    local_48 = (int *)malloc((long)(int)uVar4 << 2);
    pVVar6->pArray = local_48;
    pVVar6->nSize = uVar1;
    if (local_48 != (int *)0x0) {
      memset(local_48,0xff,(long)(int)uVar1 << 2);
      goto LAB_00941430;
    }
  }
  local_48 = (int *)0x0;
LAB_00941430:
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      pvVar3 = pVVar7->pArray[uVar8];
      if ((pvVar3 != (void *)0x0) &&
         ((uVar4 = *(uint *)((long)pvVar3 + 0x18) & 7, uVar4 == 2 || (uVar4 - 5 < 2)))) {
        iVar5 = Cudd_bddLeq(dd,*(DdNode **)((long)pvVar3 + 0x28),
                            (DdNode *)(*(ulong *)((long)pvVar2 + 0x28) ^ 1));
        if (iVar5 == 0) {
          iVar5 = Cudd_bddLeq(dd,(DdNode *)(*(ulong *)((long)pvVar3 + 0x28) ^ 1),
                              (DdNode *)(*(ulong *)((long)pvVar2 + 0x28) ^ 1));
          if (iVar5 == 0) goto LAB_009414b9;
          iVar5 = 0;
        }
        else {
          iVar5 = 1;
        }
        if (uVar1 <= uVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        local_48[uVar8] = iVar5;
      }
LAB_009414b9:
      uVar8 = uVar8 + 1;
      pVVar7 = p->vObjs;
    } while ((long)uVar8 < (long)pVVar7->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Llb_ManComputeBaseCase( Aig_Man_t * p, DdManager * dd )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj, * pRoot;
    int i;
    pRoot = Aig_ManCo( p, 0 );
    vNodes = Vec_IntStartFull( Aig_ManObjNumMax(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Cudd_bddLeq( dd, (DdNode *)pObj->pData, Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 1 );
        else if ( Cudd_bddLeq( dd, Cudd_Not((DdNode *)pObj->pData), Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 0 );
    }
    return vNodes;
}